

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

int CountNbCollisions<Blob<224>>(vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,int nbHBits)

{
  bool bVar1;
  int in_ESI;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_RDI;
  Blob<224> h2;
  Blob<224> h1;
  size_t hnb;
  int collcount;
  size_t nbH;
  int shiftBy;
  int origBits;
  int in_stack_ffffffffffffffa4;
  Blob<224> *in_stack_ffffffffffffffa8;
  Blob<224> local_4c;
  ulong local_30;
  int local_24;
  ulong local_20;
  int local_14;
  undefined4 local_10;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *local_8;
  
  local_10 = 0xe0;
  local_14 = 0xe0 - in_ESI;
  local_8 = in_RDI;
  local_20 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(in_RDI);
  local_24 = 0;
  for (local_30 = 1; local_30 < local_20; local_30 = local_30 + 1) {
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[](local_8,local_30 - 1);
    Blob<224>::operator>>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[](local_8,local_30);
    Blob<224>::operator>>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    bVar1 = Blob<224>::operator==(&local_4c,(Blob<224> *)&stack0xffffffffffffff98);
    if (bVar1) {
      local_24 = local_24 + 1;
    }
  }
  return local_24;
}

Assistant:

int CountNbCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  const int origBits = sizeof(hashtype) * 8;
  const int shiftBy = origBits - nbHBits;

  assert(shiftBy > 0);

  size_t const nbH = hashes.size();
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
    {
      collcount++;
    }
  }

  return collcount;
}